

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O1

float Amap_CutAreaDeref(Amap_Man_t *p,Amap_Mat_t *pM)

{
  char cVar1;
  ushort uVar2;
  Amap_Cut_t AVar3;
  Vec_Ptr_t *pVVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  uint uVar7;
  Amap_Cut_t *pAVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  
  uVar2 = *(ushort *)&pM->pSet->field_0x8;
  pVVar4 = p->pLib->vGates;
  if ((int)(uint)uVar2 < pVVar4->nSize) {
    fVar13 = (float)*(double *)((long)pVVar4->pArray[uVar2] + 0x20);
    pAVar8 = pM->pCut;
    if (0x1ffff < (uint)*pAVar8) {
      uVar12 = 0;
      do {
        cVar1 = pM->pSet->Ins[uVar12];
        if ((cVar1 < '\0') || (AVar3 = pAVar8[(ulong)((uint)(int)cVar1 >> 1) + 1], (int)AVar3 < 0))
        {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        if (p->vObjs->nSize <= (int)((uint)AVar3 >> 1)) goto LAB_003b0f7f;
        puVar5 = (undefined8 *)p->vObjs->pArray[(uint)AVar3 >> 1];
        iVar9 = *(int *)(puVar5 + 6) + *(int *)((long)puVar5 + 0x2c);
        if (iVar9 == 0 || SCARRY4(*(int *)(puVar5 + 6),*(int *)((long)puVar5 + 0x2c)) != iVar9 < 0)
        {
          __assert_fail("Amap_ObjRefsTotal(pFanin) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMatch.c"
                        ,0x11a,"float Amap_CutAreaDeref(Amap_Man_t *, Amap_Mat_t *)");
        }
        uVar7 = (int)cVar1 & 1;
        uVar11 = (uint)AVar3 & 1 ^ uVar7;
        uVar6 = *puVar5;
        uVar10 = (ulong)uVar11;
        if ((uVar11 != -(int)((long)uVar6 >> 0x3f)) &&
           (*(int *)((long)puVar5 + uVar10 * 4 + 0x2c) == 1)) {
          fVar13 = fVar13 + p->fAreaInv;
        }
        iVar9 = *(int *)((long)puVar5 + uVar10 * 4 + 0x2c) + -1;
        *(int *)((long)puVar5 + uVar10 * 4 + 0x2c) = iVar9;
        if ((iVar9 + *(int *)((long)puVar5 + (ulong)(uVar7 == ((uint)AVar3 & 1)) * 4 + 0x2c) == 0)
           && (uVar7 = (uint)uVar6, (uVar7 & 6) == 4 || (uVar7 & 7) == 6)) {
          fVar14 = Amap_CutAreaDeref(p,(Amap_Mat_t *)(puVar5 + 7));
          fVar13 = fVar13 + fVar14;
        }
        uVar12 = uVar12 + 1;
        pAVar8 = pM->pCut;
      } while (uVar12 < (uint)*pAVar8 >> 0x11);
    }
    return fVar13;
  }
LAB_003b0f7f:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

static inline float Amap_CutAreaDeref( Amap_Man_t * p, Amap_Mat_t * pM )
{
    Amap_Obj_t * pFanin;
    int i, fCompl;
    float Area = Amap_LibGate( p->pLib, pM->pSet->iGate )->dArea;
    Amap_MatchForEachFaninCompl( p, pM, pFanin, fCompl, i )
    {
        assert( Amap_ObjRefsTotal(pFanin) > 0 );
        if ( (int)pFanin->fPolar != fCompl && pFanin->nFouts[fCompl] == 1 )
            Area += p->fAreaInv;
        if ( --pFanin->nFouts[fCompl] + pFanin->nFouts[!fCompl] == 0 && Amap_ObjIsNode(pFanin) )
            Area += Amap_CutAreaDeref( p, &pFanin->Best );
    }
    return Area;
}